

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

void __thiscall CGameClient::OnDemoRecSnap(CGameClient *this)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  undefined8 *puVar5;
  CGameClient *pCVar6;
  long lVar7;
  CClientData *pStr;
  uint *pInts;
  long lVar8;
  long in_FS_OFFSET;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  uint *puVar3;
  undefined4 extraout_var_01;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = this;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    if (this->m_aClients[uVar4].m_Active == true) {
      iVar2 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])
                        (this->m_pClient,0xd,uVar4 & 0xffffffff,0xe8);
      puVar3 = (uint *)CONCAT44(extraout_var,iVar2);
      if (puVar3 == (uint *)0x0) goto LAB_001785e7;
      pStr = this->m_aClients + uVar4;
      *puVar3 = (uint)(uVar4 == (uint)this->m_LocalClientID);
      puVar3[1] = pStr->m_Team;
      StrToInts((int *)(puVar3 + 2),4,pStr->m_aName);
      StrToInts((int *)(puVar3 + 6),3,pStr->m_aClan);
      puVar3[9] = pStr->m_Country;
      pInts = puVar3 + 10;
      lVar8 = -6;
      for (lVar7 = 0x45b8; lVar7 != 0x47fe; lVar7 = lVar7 + 0x61) {
        StrToInts((int *)pInts,6,(char *)((long)(pCVar6->m_All).m_paComponents + lVar7 + -0x10));
        puVar3[lVar8 + 0x34] = pCVar6->m_aClients[0].m_aSkinPartColors[lVar8];
        puVar3[lVar8 + 0x3a] = pCVar6->m_aClients[0].m_SkinPartIDs[lVar8];
        lVar8 = lVar8 + 1;
        pInts = pInts + 6;
      }
    }
    pCVar6 = (CGameClient *)((pCVar6->m_NetObjHandler).m_aMsgData + 0x188);
  }
  local_b8 = 0xc8000003e8;
  uStack_b0 = 0x52800000032;
  local_a8 = 0x1f4000004b0;
  uStack_a0 = 0x5f00000096;
  local_98 = 0x1f4000009470;
  uStack_90 = 0x5dc0000012c;
  local_88 = 0xd6d800000032;
  uStack_80 = 0x8c00030d40;
  local_78 = 0x35b600000007d;
  uStack_70 = 0x7d000000c8;
  local_68 = 0x5000043238;
  uStack_60 = 0x2bc00000014;
  local_58 = 0xc8000186a0;
  uStack_50 = 0x3a9800013880;
  local_48 = 100;
  uStack_40 = 0x6400000064;
  iVar2 = mem_comp(&local_b8,&this->m_Tuning,0x80);
  if (iVar2 != 0) {
    iVar2 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])
                      (this->m_pClient,0xf,0,0x80);
    if ((void *)CONCAT44(extraout_var_00,iVar2) == (void *)0x0) goto LAB_001785e7;
    mem_copy((void *)CONCAT44(extraout_var_00,iVar2),&this->m_Tuning,0x80);
  }
  iVar2 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])(this->m_pClient,0xe,0,0x14);
  puVar5 = (undefined8 *)CONCAT44(extraout_var_01,iVar2);
  if (puVar5 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)&(this->m_GameInfo).m_TimeLimit;
    *puVar5 = *(undefined8 *)&this->m_GameInfo;
    puVar5[1] = uVar1;
    *(int *)(puVar5 + 2) = (this->m_GameInfo).m_MatchCurrent;
  }
LAB_001785e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::OnDemoRecSnap()
{
	// add client info
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(!m_aClients[i].m_Active)
			continue;

		CNetObj_De_ClientInfo *pClientInfo = static_cast<CNetObj_De_ClientInfo *>(Client()->SnapNewItem(NETOBJTYPE_DE_CLIENTINFO, i, sizeof(CNetObj_De_ClientInfo)));
		if(!pClientInfo)
			return;

		pClientInfo->m_Local = i==m_LocalClientID ? 1 : 0;
		pClientInfo->m_Team = m_aClients[i].m_Team;
		StrToInts(pClientInfo->m_aName, 4, m_aClients[i].m_aName);
		StrToInts(pClientInfo->m_aClan, 3, m_aClients[i].m_aClan);
		pClientInfo->m_Country = m_aClients[i].m_Country;

		for(int p = 0; p < NUM_SKINPARTS; p++)
		{
			StrToInts(pClientInfo->m_aaSkinPartNames[p], 6, m_aClients[i].m_aaSkinPartNames[p]);
			pClientInfo->m_aUseCustomColors[p] = m_aClients[i].m_aUseCustomColors[p];
			pClientInfo->m_aSkinPartColors[p] = m_aClients[i].m_aSkinPartColors[p];
		}
	}

	// add tuning
	CTuningParams StandardTuning;
	if(mem_comp(&StandardTuning, &m_Tuning, sizeof(CTuningParams)) != 0)
	{
		CNetObj_De_TuneParams *pTuneParams = static_cast<CNetObj_De_TuneParams *>(Client()->SnapNewItem(NETOBJTYPE_DE_TUNEPARAMS, 0, sizeof(CNetObj_De_TuneParams)));
		if(!pTuneParams)
			return;

		mem_copy(pTuneParams->m_aTuneParams, &m_Tuning, sizeof(pTuneParams->m_aTuneParams));
	}

	// add game info
	CNetObj_De_GameInfo *pGameInfo = static_cast<CNetObj_De_GameInfo *>(Client()->SnapNewItem(NETOBJTYPE_DE_GAMEINFO, 0, sizeof(CNetObj_De_GameInfo)));
	if(!pGameInfo)
		return;

	pGameInfo->m_GameFlags = m_GameInfo.m_GameFlags;
	pGameInfo->m_ScoreLimit = m_GameInfo.m_ScoreLimit;
	pGameInfo->m_TimeLimit = m_GameInfo.m_TimeLimit;
	pGameInfo->m_MatchNum = m_GameInfo.m_MatchNum;
	pGameInfo->m_MatchCurrent = m_GameInfo.m_MatchCurrent;
}